

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

size_t enet_range_coder_compress
                 (void *context,ENetBuffer *inBuffers,size_t inBufferCount,size_t inLimit,
                 enet_uint8 *outData,size_t outLimit)

{
  byte bVar1;
  ushort uVar2;
  enet_uint16 eVar3;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined1 *in_RDI;
  undefined1 *in_R8;
  long in_R9;
  ENetSymbol *node_1;
  ENetSymbol *node;
  enet_uint16 total;
  enet_uint16 *parent;
  enet_uint16 under;
  enet_uint16 count;
  enet_uint8 value;
  ENetSymbol *symbol;
  ENetSymbol *subcontext;
  size_t nextSymbol;
  size_t order;
  enet_uint16 predicted;
  ENetSymbol *root;
  enet_uint32 encodeRange;
  enet_uint32 encodeLow;
  enet_uint8 *inEnd;
  enet_uint8 *inData;
  enet_uint8 *outEnd;
  enet_uint8 *outStart;
  ENetRangeCoder *rangeCoder;
  ENetSymbol *in_stack_ffffffffffffff40;
  byte *local_b8;
  ushort *local_a8;
  ushort local_9e;
  ushort local_9c;
  ENetSymbol *local_98;
  undefined1 *local_90;
  ulong local_88;
  ulong local_80;
  ushort local_72;
  undefined1 *local_70;
  uint local_68;
  uint local_64;
  byte *local_60;
  byte *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_30;
  long local_20;
  undefined8 *local_18;
  
  local_50 = in_R8 + in_R9;
  local_64 = 0;
  local_68 = 0xffffffff;
  local_72 = 0;
  local_80 = 0;
  if (((in_RDI == (undefined1 *)0x0) || (in_RDX == 0)) || (in_RCX == 0)) {
    return 0;
  }
  local_58 = (byte *)*in_RSI;
  local_60 = local_58 + in_RSI[1];
  local_18 = in_RSI + 2;
  local_20 = in_RDX + -1;
  local_88 = 1;
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined2 *)(in_RDI + 2) = 0;
  *(undefined2 *)(in_RDI + 4) = 0;
  *(undefined2 *)(in_RDI + 6) = 0;
  *(undefined2 *)(in_RDI + 8) = 0;
  *(undefined2 *)(in_RDI + 10) = 0;
  *(undefined2 *)(in_RDI + 0xc) = 0;
  *(undefined2 *)(in_RDI + 0xe) = 0;
  *(undefined2 *)(in_RDI + 10) = 1;
  *(undefined2 *)(in_RDI + 0xc) = 0x101;
  *(undefined2 *)(in_RDI + 8) = 0;
  local_70 = in_RDI;
  local_48 = in_R8;
  local_40 = in_RDI;
  local_30 = in_R8;
LAB_001028b9:
  local_a8 = &local_72;
  if (local_60 <= local_58) {
    if (local_20 == 0) {
      while( true ) {
        if (local_64 == 0) {
          return (long)local_30 - (long)local_48;
        }
        if (local_50 <= local_30) break;
        *local_30 = (char)(local_64 >> 0x18);
        local_64 = local_64 << 8;
        local_30 = local_30 + 1;
      }
      return 0;
    }
    local_58 = (byte *)*local_18;
    local_60 = local_58 + local_18[1];
    local_18 = local_18 + 2;
    local_20 = local_20 + -1;
  }
  bVar1 = *local_58;
  local_58 = local_58 + 1;
  for (local_90 = local_40 + (ulong)local_72 * 0x10; local_90 != local_70;
      local_90 = local_40 + (ulong)*(ushort *)(local_90 + 0xe) * 0x10) {
    local_9e = 0;
    local_9c = 0;
    if (*(short *)(local_90 + 8) == 0) {
      local_98 = (ENetSymbol *)(local_40 + local_88 * 0x10);
      *(byte *)local_98 = bVar1;
      *(byte *)((long)local_98 + 1) = 2;
      *(byte *)((long)local_98 + 2) = 2;
      *(byte *)((long)local_98 + 3) = 0;
      *(byte *)((long)local_98 + 4) = 0;
      *(byte *)((long)local_98 + 5) = 0;
      *(byte *)((long)local_98 + 6) = 0;
      *(byte *)((long)local_98 + 7) = 0;
      *(byte *)((long)local_98 + 8) = 0;
      *(byte *)((long)local_98 + 9) = 0;
      *(byte *)((long)local_98 + 10) = 0;
      *(byte *)((long)local_98 + 0xb) = 0;
      *(byte *)((long)local_98 + 0xc) = 0;
      *(byte *)((long)local_98 + 0xd) = 0;
      *(byte *)((long)local_98 + 0xe) = 0;
      *(byte *)((long)local_98 + 0xf) = 0;
      *(short *)(local_90 + 8) = (short)((long)local_98 - (long)local_90 >> 4);
      local_88 = local_88 + 1;
    }
    else {
      local_b8 = local_90 + (long)(int)(uint)*(ushort *)(local_90 + 8) * 0x10;
      while( true ) {
        for (; bVar1 < *local_b8;
            local_b8 = local_b8 + (long)(int)(uint)*(ushort *)(local_b8 + 4) * 0x10) {
          *(short *)(local_b8 + 2) = *(short *)(local_b8 + 2) + 2;
          if (*(short *)(local_b8 + 4) == 0) {
            local_98 = (ENetSymbol *)(local_40 + local_88 * 0x10);
            *(byte *)local_98 = bVar1;
            *(byte *)((long)local_98 + 1) = 2;
            *(byte *)((long)local_98 + 2) = 2;
            *(byte *)((long)local_98 + 3) = 0;
            *(byte *)((long)local_98 + 4) = 0;
            *(byte *)((long)local_98 + 5) = 0;
            *(byte *)((long)local_98 + 6) = 0;
            *(byte *)((long)local_98 + 7) = 0;
            *(byte *)((long)local_98 + 8) = 0;
            *(byte *)((long)local_98 + 9) = 0;
            *(byte *)((long)local_98 + 10) = 0;
            *(byte *)((long)local_98 + 0xb) = 0;
            *(byte *)((long)local_98 + 0xc) = 0;
            *(byte *)((long)local_98 + 0xd) = 0;
            *(byte *)((long)local_98 + 0xe) = 0;
            *(byte *)((long)local_98 + 0xf) = 0;
            *(short *)(local_b8 + 4) = (short)((long)local_98 - (long)local_b8 >> 4);
            local_88 = local_88 + 1;
            goto LAB_00102caf;
          }
        }
        if (bVar1 <= *local_b8) {
          local_9c = (ushort)local_b8[1];
          local_9e = local_9e + (*(short *)(local_b8 + 2) - (ushort)local_b8[1]);
          *(short *)(local_b8 + 2) = *(short *)(local_b8 + 2) + 2;
          local_b8[1] = local_b8[1] + 2;
          local_98 = (ENetSymbol *)local_b8;
          goto LAB_00102caf;
        }
        local_9e = local_9e + *(short *)(local_b8 + 2);
        if (*(short *)(local_b8 + 6) == 0) break;
        local_b8 = local_b8 + (long)(int)(uint)*(ushort *)(local_b8 + 6) * 0x10;
      }
      local_98 = (ENetSymbol *)(local_40 + local_88 * 0x10);
      *(byte *)local_98 = bVar1;
      *(byte *)((long)local_98 + 1) = 2;
      *(byte *)((long)local_98 + 2) = 2;
      *(byte *)((long)local_98 + 3) = 0;
      *(byte *)((long)local_98 + 4) = 0;
      *(byte *)((long)local_98 + 5) = 0;
      *(byte *)((long)local_98 + 6) = 0;
      *(byte *)((long)local_98 + 7) = 0;
      *(byte *)((long)local_98 + 8) = 0;
      *(byte *)((long)local_98 + 9) = 0;
      *(byte *)((long)local_98 + 10) = 0;
      *(byte *)((long)local_98 + 0xb) = 0;
      *(byte *)((long)local_98 + 0xc) = 0;
      *(byte *)((long)local_98 + 0xd) = 0;
      *(byte *)((long)local_98 + 0xe) = 0;
      *(byte *)((long)local_98 + 0xf) = 0;
      *(short *)(local_b8 + 6) = (short)((long)local_98 - (long)local_b8 >> 4);
      local_88 = local_88 + 1;
    }
LAB_00102caf:
    *local_a8 = (ushort)((long)local_98 - (long)local_40 >> 4);
    local_a8 = (ushort *)((long)local_98 + 0xe);
    uVar2 = *(ushort *)(local_90 + 0xc);
    if (local_9c != 0) {
      local_64 = ((uint)*(ushort *)(local_90 + 10) + (uint)local_9e) * (local_68 / uVar2) + local_64
      ;
      local_68 = (uint)local_9c * (local_68 / uVar2);
      do {
        if (0xffffff < (local_64 ^ local_64 + local_68)) {
          if (0xffff < local_68) goto LAB_00102ecd;
          local_68 = -local_64 & 0xffff;
        }
        if (local_50 <= local_30) {
          return 0;
        }
        *local_30 = (char)(local_64 >> 0x18);
        local_68 = local_68 << 8;
        local_64 = local_64 << 8;
        local_30 = local_30 + 1;
      } while( true );
    }
    if ((*(short *)(local_90 + 10) != 0) && (*(ushort *)(local_90 + 10) < uVar2)) {
      local_68 = (uint)*(ushort *)(local_90 + 10) * (local_68 / uVar2);
      do {
        if (0xffffff < (local_64 ^ local_64 + local_68)) {
          if (0xffff < local_68) break;
          local_68 = -local_64 & 0xffff;
        }
        if (local_50 <= local_30) {
          return 0;
        }
        *local_30 = (char)(local_64 >> 0x18);
        local_68 = local_68 << 8;
        local_64 = local_64 << 8;
        local_30 = local_30 + 1;
      } while( true );
    }
    *(short *)(local_90 + 10) = *(short *)(local_90 + 10) + 5;
    *(short *)(local_90 + 0xc) = *(short *)(local_90 + 0xc) + 5;
LAB_00102ecd:
    *(short *)(local_90 + 0xc) = *(short *)(local_90 + 0xc) + 2;
    if ((0xfb < local_9c) || (0xff00 < *(ushort *)(local_90 + 0xc))) {
      if (*(short *)(local_90 + 8) == 0) {
        eVar3 = 0;
      }
      else {
        eVar3 = enet_symbol_rescale(in_stack_ffffffffffffff40);
      }
      *(enet_uint16 *)(local_90 + 0xc) = eVar3;
      *(short *)(local_90 + 10) =
           *(short *)(local_90 + 10) - (short)((int)(uint)*(ushort *)(local_90 + 10) >> 1);
      *(short *)(local_90 + 0xc) = *(short *)(local_90 + 0xc) + *(short *)(local_90 + 10);
    }
    if (local_9c != 0) goto LAB_001034a8;
  }
  local_9e = (ushort)bVar1;
  local_9c = 1;
  if (*(short *)(local_70 + 8) == 0) {
    local_98 = (ENetSymbol *)(local_40 + local_88 * 0x10);
    local_98->value = bVar1;
    local_98->count = '\x03';
    local_98->under = 3;
    local_98->left = 0;
    local_98->right = 0;
    local_98->symbols = 0;
    local_98->escapes = 0;
    local_98->total = 0;
    local_98->parent = 0;
    *(short *)(local_70 + 8) = (short)((long)local_98 - (long)local_70 >> 4);
    local_88 = local_88 + 1;
  }
  else {
    in_stack_ffffffffffffff40 =
         (ENetSymbol *)(local_70 + (long)(int)(uint)*(ushort *)(local_70 + 8) * 0x10);
    while( true ) {
      for (; bVar1 < in_stack_ffffffffffffff40->value;
          in_stack_ffffffffffffff40 =
               in_stack_ffffffffffffff40 + (int)(uint)in_stack_ffffffffffffff40->left) {
        in_stack_ffffffffffffff40->under = in_stack_ffffffffffffff40->under + 3;
        if (in_stack_ffffffffffffff40->left == 0) {
          local_98 = (ENetSymbol *)(local_40 + local_88 * 0x10);
          local_98->value = bVar1;
          local_98->count = '\x03';
          local_98->under = 3;
          local_98->left = 0;
          local_98->right = 0;
          local_98->symbols = 0;
          local_98->escapes = 0;
          local_98->total = 0;
          local_98->parent = 0;
          in_stack_ffffffffffffff40->left =
               (enet_uint16)((long)local_98 - (long)in_stack_ffffffffffffff40 >> 4);
          local_88 = local_88 + 1;
          goto LAB_001032f2;
        }
      }
      if (bVar1 <= in_stack_ffffffffffffff40->value) {
        local_9c = in_stack_ffffffffffffff40->count + 1;
        local_9e = local_9e +
                   (in_stack_ffffffffffffff40->under - (ushort)in_stack_ffffffffffffff40->count);
        in_stack_ffffffffffffff40->under = in_stack_ffffffffffffff40->under + 3;
        in_stack_ffffffffffffff40->count = in_stack_ffffffffffffff40->count + '\x03';
        local_98 = in_stack_ffffffffffffff40;
        goto LAB_001032f2;
      }
      local_9e = local_9e + in_stack_ffffffffffffff40->under;
      if (in_stack_ffffffffffffff40->right == 0) break;
      in_stack_ffffffffffffff40 =
           in_stack_ffffffffffffff40 + (int)(uint)in_stack_ffffffffffffff40->right;
    }
    local_98 = (ENetSymbol *)(local_40 + local_88 * 0x10);
    local_98->value = bVar1;
    local_98->count = '\x03';
    local_98->under = 3;
    local_98->left = 0;
    local_98->right = 0;
    local_98->symbols = 0;
    local_98->escapes = 0;
    local_98->total = 0;
    local_98->parent = 0;
    in_stack_ffffffffffffff40->right =
         (enet_uint16)((long)local_98 - (long)in_stack_ffffffffffffff40 >> 4);
    local_88 = local_88 + 1;
  }
LAB_001032f2:
  *local_a8 = (ushort)((long)local_98 - (long)local_40 >> 4);
  local_64 = ((uint)*(ushort *)(local_70 + 10) + (uint)local_9e) *
             (local_68 / *(ushort *)(local_70 + 0xc)) + local_64;
  local_68 = (uint)local_9c * (local_68 / *(ushort *)(local_70 + 0xc));
  do {
    if (0xffffff < (local_64 ^ local_64 + local_68)) {
      if (0xffff < local_68) break;
      local_68 = -local_64 & 0xffff;
    }
    if (local_50 <= local_30) {
      return 0;
    }
    *local_30 = (char)(local_64 >> 0x18);
    local_68 = local_68 << 8;
    local_64 = local_64 << 8;
    local_30 = local_30 + 1;
  } while( true );
  *(short *)(local_70 + 0xc) = *(short *)(local_70 + 0xc) + 3;
  if ((0xfa < local_9c) || (0xff00 < *(ushort *)(local_70 + 0xc))) {
    if (*(short *)(local_70 + 8) == 0) {
      eVar3 = 0;
    }
    else {
      eVar3 = enet_symbol_rescale(in_stack_ffffffffffffff40);
    }
    *(enet_uint16 *)(local_70 + 0xc) = eVar3;
    *(short *)(local_70 + 10) =
         *(short *)(local_70 + 10) - (short)((int)(uint)*(ushort *)(local_70 + 10) >> 1);
    *(short *)(local_70 + 0xc) = *(short *)(local_70 + 0xc) + *(short *)(local_70 + 10) + 0x100;
  }
LAB_001034a8:
  if (local_80 < 2) {
    local_80 = local_80 + 1;
  }
  else {
    local_72 = *(ushort *)(local_40 + (ulong)local_72 * 0x10 + 0xe);
  }
  if (0xffd < local_88) {
    local_88 = 1;
    local_70 = local_40;
    *local_40 = 0;
    local_40[1] = 0;
    *(undefined2 *)(local_40 + 2) = 0;
    *(undefined2 *)(local_40 + 4) = 0;
    *(undefined2 *)(local_40 + 6) = 0;
    *(undefined2 *)(local_40 + 8) = 0;
    *(undefined2 *)(local_40 + 10) = 0;
    *(undefined2 *)(local_40 + 0xc) = 0;
    *(undefined2 *)(local_40 + 0xe) = 0;
    *(undefined2 *)(local_40 + 10) = 1;
    *(undefined2 *)(local_40 + 0xc) = 0x101;
    *(undefined2 *)(local_40 + 8) = 0;
    local_72 = 0;
    local_80 = 0;
  }
  goto LAB_001028b9;
}

Assistant:

size_t
enet_range_coder_compress (void * context, const ENetBuffer * inBuffers, size_t inBufferCount, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inData, * inEnd;
    enet_uint32 encodeLow = 0, encodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;

    if (rangeCoder == NULL || inBufferCount <= 0 || inLimit <= 0)
      return 0;

    inData = (const enet_uint8 *) inBuffers -> data;
    inEnd = & inData [inBuffers -> dataLength];
    inBuffers ++;
    inBufferCount --;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    for (;;)
    {
        ENetSymbol * subcontext, * symbol;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value;
        enet_uint16 count, under, * parent = & predicted, total;
        if (inData >= inEnd)
        {
            if (inBufferCount <= 0)
              break;
            inData = (const enet_uint8 *) inBuffers -> data;
            inEnd = & inData [inBuffers -> dataLength];
            inBuffers ++;
            inBufferCount --;
        }
        value = * inData ++;
    
        for (subcontext = & rangeCoder -> symbols [predicted]; 
             subcontext != root; 
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            ENET_CONTEXT_ENCODE (subcontext, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
              ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, 0);
#endif
            if (count > 0)
            {
                ENET_RANGE_CODER_ENCODE (subcontext -> escapes + under, count, total);
            }
            else
            {
                if (subcontext -> escapes > 0 && subcontext -> escapes < total) 
                    ENET_RANGE_CODER_ENCODE (0, subcontext -> escapes, total); 
                subcontext -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                subcontext -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            if (count > 0) goto nextInput;
        }

        ENET_CONTEXT_ENCODE (root, symbol, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM);
        * parent = symbol - rangeCoder -> symbols;
        parent = & symbol -> parent;
        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
          ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, ENET_CONTEXT_SYMBOL_MINIMUM); 
#endif
        ENET_RANGE_CODER_ENCODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA; 
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    nextInput:
        if (order >= ENET_SUBCONTEXT_ORDER) 
          predicted = rangeCoder -> symbols [predicted].parent;
        else 
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }

    ENET_RANGE_CODER_FLUSH;

    return (size_t) (outData - outStart);
}